

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_string_converters.h
# Opt level: O1

string * __thiscall
common::vector_to_string_abi_cxx11_
          (string *__return_storage_ptr__,common *this,
          vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_> *v)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong uVar9;
  long *plVar10;
  ulong *puVar11;
  ulong uVar12;
  uint *puVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  __normal_iterator<join::JoinResultElement_*,_std::vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_>_>
  __i;
  long lVar17;
  string *s;
  string __str_2;
  string __str_1;
  string __str;
  long *local_168;
  undefined8 local_160;
  long local_158;
  undefined8 uStack_150;
  ulong *local_148;
  long local_140;
  ulong local_138 [2];
  ulong *local_128;
  long local_120;
  ulong local_118 [2];
  long *local_108;
  undefined8 local_100;
  long local_f8;
  undefined8 uStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88 [2];
  long local_78 [2];
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  uint *local_48;
  uint *local_40;
  double local_38;
  
  lVar2 = *(long *)this;
  lVar3 = *(long *)(this + 8);
  if (lVar2 != lVar3) {
    uVar6 = lVar3 - lVar2 >> 4;
    lVar17 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<join::JoinResultElement*,std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<common::vector_to_string[abi:cxx11](std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>&)::__0>>
              (lVar2,lVar3,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar3 - lVar2 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<join::JoinResultElement*,std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>>,__gnu_cxx::__ops::_Iter_comp_iter<common::vector_to_string[abi:cxx11](std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>&)::__0>>
                (lVar2,lVar3);
    }
    else {
      lVar17 = lVar2 + 0x100;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<join::JoinResultElement*,std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>>,__gnu_cxx::__ops::_Iter_comp_iter<common::vector_to_string[abi:cxx11](std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>&)::__0>>
                (lVar2,lVar17);
      for (; lVar17 != lVar3; lVar17 = lVar17 + 0x10) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<join::JoinResultElement*,std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>>,__gnu_cxx::__ops::_Val_comp_iter<common::vector_to_string[abi:cxx11](std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>&)::__0>>
                  (lVar17);
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar13 = *(uint **)this;
  local_48 = *(uint **)(this + 8);
  if (puVar13 != local_48) {
    do {
      uVar16 = *puVar13;
      uVar15 = -uVar16;
      if (0 < (int)uVar16) {
        uVar15 = uVar16;
      }
      uVar14 = 1;
      if (9 < uVar15) {
        uVar6 = (ulong)uVar15;
        uVar1 = 4;
        do {
          uVar14 = uVar1;
          uVar5 = (uint)uVar6;
          if (uVar5 < 100) {
            uVar14 = uVar14 - 2;
            goto LAB_00103b57;
          }
          if (uVar5 < 1000) {
            uVar14 = uVar14 - 1;
            goto LAB_00103b57;
          }
          if (uVar5 < 10000) goto LAB_00103b57;
          uVar6 = uVar6 / 10000;
          uVar1 = uVar14 + 4;
        } while (99999 < uVar5);
        uVar14 = uVar14 + 1;
      }
LAB_00103b57:
      uVar1 = puVar13[1];
      local_38 = *(double *)(puVar13 + 2);
      local_88[0] = local_78;
      local_40 = puVar13;
      std::__cxx11::string::_M_construct((ulong)local_88,(char)uVar14 - (char)((int)uVar16 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar16 >> 0x1f) + (long)local_88[0]),uVar14,uVar15);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_88,0,(char *)0x0,0x123074);
      local_a8 = &local_98;
      plVar10 = plVar7 + 2;
      if ((long *)*plVar7 == plVar10) {
        local_98 = *plVar10;
        lStack_90 = plVar7[3];
      }
      else {
        local_98 = *plVar10;
        local_a8 = (long *)*plVar7;
      }
      local_a0 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
      puVar11 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar11) {
        local_d8 = *puVar11;
        lStack_d0 = plVar7[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *puVar11;
        local_e8 = (ulong *)*plVar7;
      }
      local_e0 = plVar7[1];
      *plVar7 = (long)puVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      uVar16 = -uVar1;
      if (0 < (int)uVar1) {
        uVar16 = uVar1;
      }
      uVar15 = 1;
      if (9 < uVar16) {
        uVar6 = (ulong)uVar16;
        uVar14 = 4;
        do {
          uVar15 = uVar14;
          uVar5 = (uint)uVar6;
          if (uVar5 < 100) {
            uVar15 = uVar15 - 2;
            goto LAB_00103cd9;
          }
          if (uVar5 < 1000) {
            uVar15 = uVar15 - 1;
            goto LAB_00103cd9;
          }
          if (uVar5 < 10000) goto LAB_00103cd9;
          uVar6 = uVar6 / 10000;
          uVar14 = uVar15 + 4;
        } while (99999 < uVar5);
        uVar15 = uVar15 + 1;
      }
LAB_00103cd9:
      local_128 = local_118;
      std::__cxx11::string::_M_construct
                ((ulong)&local_128,(char)uVar15 - (char)((int)uVar1 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_128),uVar15,uVar16);
      uVar6 = 0xf;
      if (local_e8 != &local_d8) {
        uVar6 = local_d8;
      }
      if (uVar6 < (ulong)(local_120 + local_e0)) {
        uVar6 = 0xf;
        if (local_128 != local_118) {
          uVar6 = local_118[0];
        }
        if (uVar6 < (ulong)(local_120 + local_e0)) goto LAB_00103d6e;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_e8);
      }
      else {
LAB_00103d6e:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_128);
      }
      plVar7 = puVar8 + 2;
      if ((long *)*puVar8 == plVar7) {
        local_f8 = *plVar7;
        uStack_f0 = puVar8[3];
        local_108 = &local_f8;
      }
      else {
        local_f8 = *plVar7;
        local_108 = (long *)*puVar8;
      }
      local_100 = puVar8[1];
      *puVar8 = plVar7;
      puVar8[1] = 0;
      *(undefined1 *)plVar7 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_108);
      puVar11 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar11) {
        local_b8 = *puVar11;
        lStack_b0 = plVar7[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *puVar11;
        local_c8 = (ulong *)*plVar7;
      }
      local_c0 = plVar7[1];
      *plVar7 = (long)puVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      uVar9 = lround(local_38);
      uVar6 = -uVar9;
      if (0 < (long)uVar9) {
        uVar6 = uVar9;
      }
      uVar16 = 1;
      if (9 < uVar6) {
        uVar12 = uVar6;
        uVar15 = 4;
        do {
          uVar16 = uVar15;
          if (uVar12 < 100) {
            uVar16 = uVar16 - 2;
            goto LAB_00103ea6;
          }
          if (uVar12 < 1000) {
            uVar16 = uVar16 - 1;
            goto LAB_00103ea6;
          }
          if (uVar12 < 10000) goto LAB_00103ea6;
          bVar4 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          uVar15 = uVar16 + 4;
        } while (bVar4);
        uVar16 = uVar16 + 1;
      }
LAB_00103ea6:
      local_148 = local_138;
      std::__cxx11::string::_M_construct
                ((ulong)&local_148,(char)uVar16 - (char)((long)uVar9 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)((long)local_148 - ((long)uVar9 >> 0x3f)),uVar16,uVar6);
      uVar6 = 0xf;
      if (local_c8 != &local_b8) {
        uVar6 = local_b8;
      }
      if (uVar6 < (ulong)(local_140 + local_c0)) {
        uVar6 = 0xf;
        if (local_148 != local_138) {
          uVar6 = local_138[0];
        }
        if (uVar6 < (ulong)(local_140 + local_c0)) goto LAB_00103f3c;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,(ulong)local_c8);
      }
      else {
LAB_00103f3c:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_148);
      }
      local_168 = &local_158;
      plVar7 = puVar8 + 2;
      if ((long *)*puVar8 == plVar7) {
        local_158 = *plVar7;
        uStack_150 = puVar8[3];
      }
      else {
        local_158 = *plVar7;
        local_168 = (long *)*puVar8;
      }
      local_160 = puVar8[1];
      *puVar8 = plVar7;
      puVar8[1] = 0;
      *(undefined1 *)plVar7 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_168);
      plVar10 = plVar7 + 2;
      if ((long *)*plVar7 == plVar10) {
        local_58 = *plVar10;
        lStack_50 = plVar7[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar10;
        local_68 = (long *)*plVar7;
      }
      local_60 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68);
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
      if (local_168 != &local_158) {
        operator_delete(local_168,local_158 + 1);
      }
      if (local_148 != local_138) {
        operator_delete(local_148,local_138[0] + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      if (local_128 != local_118) {
        operator_delete(local_128,local_118[0] + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98 + 1);
      }
      if (local_88[0] != local_78) {
        operator_delete(local_88[0],local_78[0] + 1);
      }
      puVar13 = local_40 + 4;
    } while (puVar13 != local_48);
  }
  std::__cxx11::string::pop_back();
  return __return_storage_ptr__;
}

Assistant:

std::string vector_to_string(std::vector<join::JoinResultElement>& v) {
  // Sort the vector using lambda function implemented here.
  std::sort(v.begin(), v.end(), [](const join::JoinResultElement& a,
                                   const join::JoinResultElement& b){
    if (a.tree_id_1 < b.tree_id_1) {
      return true;
    } else if (a.tree_id_1 == b.tree_id_1) {
      if (a.tree_id_2 < b.tree_id_2) {
        return true;
      } else if (a.tree_id_2 == b.tree_id_2) {
        if (a.ted_value < b.ted_value) {
          return true;
        }
      }
    }
    return false;
  });
  // Convert vector to string.
  std::string s;
  for (auto e : v) {
    s += "{" + std::to_string(e.tree_id_1) + "," + std::to_string(e.tree_id_2)
        + "," + std::to_string(std::lround(e.ted_value)) + "},";
  }
  s.pop_back(); // Delete the last comma.
  return s;
}